

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_widget.h
# Opt level: O1

void __thiscall
nesvis::MemoryWidget::draw_mem_value
          (MemoryWidget *this,uint16_t address,optional<unsigned_char> *mem_value)

{
  ImVec2 IVar1;
  bool bVar2;
  ImDrawList *this_00;
  char *fmt;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v8::basic_format_context<fmt::v8::appender,_char>_>_2
  in_R9;
  ImVec2 IVar3;
  string_view fmt_00;
  format_args args;
  ImVec2 pos;
  ImVec2 local_48 [2];
  undefined1 local_38 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_28;
  
  if ((mem_value->super__Optional_base<unsigned_char,_true,_true>)._M_payload.
      super__Optional_payload_base<unsigned_char>._M_engaged == true) {
    if ((mem_value->super__Optional_base<unsigned_char,_true,_true>)._M_payload.
        super__Optional_payload_base<unsigned_char>._M_payload._M_value != '\0') {
      ImGui::Text("%02hhX");
      goto LAB_00110e2e;
    }
    fmt = "00";
  }
  else {
    fmt = " -";
  }
  ImGui::TextDisabled(fmt);
LAB_00110e2e:
  bVar2 = ImGui::IsItemHovered(0);
  if (bVar2) {
    IVar1._2_6_ = 0;
    IVar1.x._0_2_ = address;
    fmt_00.size_ = 2;
    fmt_00.data_ = (char *)0x6;
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)local_48;
    local_48[0] = IVar1;
    ::fmt::v8::vformat_abi_cxx11_((string *)local_38,(v8 *)0x1d7329,fmt_00,args);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&this->goto_address_input_,(string *)local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._0_8_ != &local_28) {
      operator_delete((void *)local_38._0_8_,local_28._M_allocated_capacity + 1);
    }
    IVar3 = ImGui::GetItemRectMin();
    local_38._0_4_ = IVar3.x;
    local_38._0_4_ = (float)local_38._0_4_ + -4.0;
    local_38._4_4_ = IVar3.y;
    local_38._4_4_ = (float)local_38._4_4_ + -4.0;
    this_00 = ImGui::GetWindowDrawList();
    local_48[0].y = (float)local_38._4_4_ + 24.0;
    local_48[0].x = (float)local_38._0_4_ + 24.0;
    ImDrawList::AddRectFilled(this_00,(ImVec2 *)local_38,local_48,0x64969696,0.0,0);
    ImGui::BeginTooltip();
    ImGui::Text("%04hX",IVar1);
    ImGui::EndTooltip();
  }
  return;
}

Assistant:

void draw_mem_value(uint16_t address,
            const std::optional<uint8_t> &mem_value) {
        if (mem_value) {
            if (mem_value.value() == 0u) {
                ImGui::TextDisabled("00");
            } else {
                ImGui::Text("%02hhX", mem_value.value());
            }
        } else {
            ImGui::TextDisabled(" -");
        }

        if (ImGui::IsItemHovered()) {
            goto_address_input_ = fmt::format("{:04X}", address);

            ImVec2 pos = ImGui::GetItemRectMin();
            pos.x -= 4;
            pos.y -= 4;
            const auto color = IM_COL32(150u, 150u, 150u, 100u);
            ImGui::GetWindowDrawList()->AddRectFilled(
                    pos, ImVec2(pos.x + 24, pos.y + 24), color);

            ImGui::BeginTooltip();
            ImGui::Text("%04hX", address);
            ImGui::EndTooltip();
        }
    }